

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall
kratos::SynthesizableVisitor::visit(SynthesizableVisitor *this,FunctionCallStmt *stmt)

{
  int iVar1;
  string local_58;
  undefined1 local_38 [8];
  optional<kratos::BuiltinFunctionInfo> info;
  FunctionCallStmt *stmt_local;
  
  info.super__Optional_base<kratos::BuiltinFunctionInfo,_true,_true>._M_payload.
  super__Optional_payload_base<kratos::BuiltinFunctionInfo>._16_8_ = stmt;
  iVar1 = (*(((stmt->func_).
              super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xf])();
  if ((char)iVar1 == '\0') {
    iVar1 = (*(((stmt->func_).
                super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0x10])();
    if ((char)iVar1 == '\0') {
      return;
    }
    std::__cxx11::string::string
              ((string *)&local_58,
               (string *)
               &((stmt->func_).
                 super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                function_name_);
    get_builtin_function_info((optional<kratos::BuiltinFunctionInfo> *)local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    if (info.super__Optional_base<kratos::BuiltinFunctionInfo,_true,_true>._M_payload.
        super__Optional_payload_base<kratos::BuiltinFunctionInfo>._M_payload._M_value.max_num_args.
        _0_1_ != '\x01') {
      return;
    }
    if ((bool)local_38[4] != false) {
      return;
    }
  }
  std::vector<kratos::IRNode*,std::allocator<kratos::IRNode*>>::
  emplace_back<kratos::FunctionCallStmt*&>
            ((vector<kratos::IRNode*,std::allocator<kratos::IRNode*>> *)&this->nodes_,
             (FunctionCallStmt **)
             ((long)&info.super__Optional_base<kratos::BuiltinFunctionInfo,_true,_true>._M_payload.
                     super__Optional_payload_base<kratos::BuiltinFunctionInfo>._M_payload + 0x10));
  return;
}

Assistant:

void visit(FunctionCallStmt* stmt) override {
        auto const& def = stmt->func();
        if (def->is_dpi()) {
            nodes_.emplace_back(stmt);
        } else if (def->is_builtin()) {
            auto info = get_builtin_function_info(def->function_name());
            if (info && !info->synthesizable) {
                nodes_.emplace_back(stmt);
            }
        }
    }